

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::CopyFrom
          (CategoricalCrossEntropyLossLayer *this,CategoricalCrossEntropyLossLayer *from)

{
  CategoricalCrossEntropyLossLayer *from_local;
  CategoricalCrossEntropyLossLayer *this_local;
  
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
  }
  return;
}

Assistant:

void CategoricalCrossEntropyLossLayer::CopyFrom(const CategoricalCrossEntropyLossLayer& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}